

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

int Acb_ObjComputeLevelR(Acb_Ntk_t *p,int iObj)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *pVVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if ((-1 < iObj) && (iObj < (p->vFanouts).nSize)) {
    pVVar3 = (p->vFanouts).pArray;
    uVar1 = pVVar3[(uint)iObj].nSize;
    uVar6 = 0;
    uVar5 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar5 = uVar6;
    }
    iVar4 = 0;
    do {
      if (uVar5 == uVar6) {
        if (iObj != 0) {
          if (iObj < (p->vObjType).nSize) {
            if (iObj < (p->vLevelR).nSize) {
              iVar4 = iVar4 + (uint)((byte)((p->vObjType).pArray[(uint)iObj] - 5U) < 0xfe);
              (p->vLevelR).pArray[(uint)iObj] = iVar4;
              return iVar4;
            }
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
LAB_00382ec5:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
LAB_00382ea6:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                      ,0xee,"Acb_ObjType_t Acb_ObjType(Acb_Ntk_t *, int)");
      }
      iVar2 = pVVar3[(uint)iObj].pArray[uVar6];
      lVar7 = (long)iVar2;
      if (lVar7 < 1) goto LAB_00382ea6;
      if ((p->vObjType).nSize <= iVar2) goto LAB_00382ec5;
      if ((p->vObjType).pArray[lVar7] != '\0') {
        if ((p->vLevelR).nSize <= iVar2) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar2 = (p->vLevelR).pArray[lVar7];
        if (iVar4 <= iVar2) {
          iVar4 = iVar2;
        }
      }
      uVar6 = uVar6 + 1;
    } while (-1 < iObj);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
}

Assistant:

int Acb_ObjComputeLevelR( Acb_Ntk_t * p, int iObj )
{
    int iFanout, k, Level = 0;
    Acb_ObjForEachFanout( p, iObj, iFanout, k )
        Level = Abc_MaxInt( Level, Acb_ObjLevelR(p, iFanout) );
    return Acb_ObjSetLevelR( p, iObj, Level + !Acb_ObjIsCio(p, iObj) );
}